

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_interp.c
# Opt level: O3

sunrealtype LBasisD(ARKInterp I,int j,sunrealtype t)

{
  double dVar1;
  void *pvVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  sunrealtype sVar6;
  double dVar7;
  
  pvVar2 = I->content;
  uVar3 = (ulong)*(int *)((long)pvVar2 + 0x18);
  if ((long)uVar3 < 1) {
    sVar6 = 0.0;
  }
  else {
    sVar6 = 0.0;
    uVar4 = 0;
    do {
      if (uVar4 != (uint)j) {
        uVar5 = 0;
        dVar7 = 1.0;
        do {
          if (uVar4 != uVar5 && (uint)j != uVar5) {
            dVar1 = *(double *)(*(long *)((long)pvVar2 + 0x10) + uVar5 * 8);
            dVar7 = dVar7 * ((t - dVar1) /
                            (*(double *)(*(long *)((long)pvVar2 + 0x10) + (long)j * 8) - dVar1));
          }
          uVar5 = uVar5 + 1;
        } while (uVar3 != uVar5);
        sVar6 = sVar6 + dVar7 / (*(double *)(*(long *)((long)pvVar2 + 0x10) + (long)j * 8) -
                                *(double *)(*(long *)((long)pvVar2 + 0x10) + uVar4 * 8));
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != uVar3);
  }
  return sVar6;
}

Assistant:

sunrealtype LBasisD(ARKInterp I, int j, sunrealtype t)
{
  int i, k;
  sunrealtype p, q;
  p = ZERO;
  for (i = 0; i < LINT_NHIST(I); i++)
  {
    if (i == j) { continue; }
    q = ONE;
    for (k = 0; k < LINT_NHIST(I); k++)
    {
      if (k == j) { continue; }
      if (k == i) { continue; }
      q *= (t - LINT_TJ(I, k)) / (LINT_TJ(I, j) - LINT_TJ(I, k));
    }
    p += q / (LINT_TJ(I, j) - LINT_TJ(I, i));
  }

  return (p);
}